

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall ON_FontList::ON_FontList(ON_FontList *this)

{
  ON_FontListImpl *this_00;
  ON__UINT_PTR *local_50;
  ON_FontList *this_local;
  
  this->m_name_locale = LocalizedFirst;
  this->m_bMatchUnderlineStrikethroughAndPointSize = false;
  ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&this->m_by_index);
  ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&this->m_unsorted);
  this_00 = (ON_FontListImpl *)operator_new(0xc0);
  memset(this_00,0,0xc0);
  ON_FontListImpl::ON_FontListImpl(this_00);
  this->m_sorted = this_00;
  local_50 = this->m_reserved;
  do {
    *local_50 = 0;
    local_50 = local_50 + 1;
  } while ((ON_ClassArray<ON_FontFaceQuartet> *)local_50 != &this->m_quartet_list);
  ON_ClassArray<ON_FontFaceQuartet>::ON_ClassArray(&this->m_quartet_list);
  return;
}

Assistant:

ON_FontList::ON_FontList()
  : m_sorted(*(new ON_FontListImpl()))
{}